

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Imputer::SerializeWithCachedSizes(Imputer *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  int64 iVar3;
  char *pcVar4;
  string *psVar5;
  double dVar6;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Imputer *this_local;
  
  bVar1 = has_imputeddoublevalue(this);
  if (bVar1) {
    dVar6 = imputeddoublevalue(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(1,dVar6,output);
  }
  bVar1 = has_imputedint64value(this);
  if (bVar1) {
    iVar3 = imputedint64value(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(2,iVar3,output);
  }
  bVar1 = has_imputedstringvalue(this);
  if (bVar1) {
    imputedstringvalue_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    imputedstringvalue_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,iVar2,SERIALIZE,"CoreML.Specification.Imputer.imputedStringValue");
    psVar5 = imputedstringvalue_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(3,psVar5,output);
  }
  bVar1 = has_imputeddoublearray(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&((this->ImputedValue_).imputeddoublearray_)->super_MessageLite,output);
  }
  bVar1 = has_imputedint64array(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (5,&((this->ImputedValue_).imputeddoublearray_)->super_MessageLite,output);
  }
  bVar1 = has_imputedstringdictionary(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (6,&((this->ImputedValue_).imputeddoublearray_)->super_MessageLite,output);
  }
  bVar1 = has_imputedint64dictionary(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (7,&((this->ImputedValue_).imputeddoublearray_)->super_MessageLite,output);
  }
  bVar1 = has_replacedoublevalue(this);
  if (bVar1) {
    dVar6 = replacedoublevalue(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(0xb,dVar6,output);
  }
  bVar1 = has_replaceint64value(this);
  if (bVar1) {
    iVar3 = replaceint64value(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(0xc,iVar3,output);
  }
  bVar1 = has_replacestringvalue(this);
  if (bVar1) {
    replacestringvalue_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    replacestringvalue_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,iVar2,SERIALIZE,"CoreML.Specification.Imputer.replaceStringValue");
    psVar5 = replacestringvalue_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xd,psVar5,output);
  }
  return;
}

Assistant:

void Imputer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Imputer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // double imputedDoubleValue = 1;
  if (has_imputeddoublevalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(1, this->imputeddoublevalue(), output);
  }

  // int64 imputedInt64Value = 2;
  if (has_imputedint64value()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->imputedint64value(), output);
  }

  // string imputedStringValue = 3;
  if (has_imputedstringvalue()) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->imputedstringvalue().data(), this->imputedstringvalue().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Imputer.imputedStringValue");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->imputedstringvalue(), output);
  }

  // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
  if (has_imputeddoublearray()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *ImputedValue_.imputeddoublearray_, output);
  }

  // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
  if (has_imputedint64array()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      5, *ImputedValue_.imputedint64array_, output);
  }

  // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
  if (has_imputedstringdictionary()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      6, *ImputedValue_.imputedstringdictionary_, output);
  }

  // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
  if (has_imputedint64dictionary()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      7, *ImputedValue_.imputedint64dictionary_, output);
  }

  // double replaceDoubleValue = 11;
  if (has_replacedoublevalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(11, this->replacedoublevalue(), output);
  }

  // int64 replaceInt64Value = 12;
  if (has_replaceint64value()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(12, this->replaceint64value(), output);
  }

  // string replaceStringValue = 13;
  if (has_replacestringvalue()) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->replacestringvalue().data(), this->replacestringvalue().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Imputer.replaceStringValue");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      13, this->replacestringvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Imputer)
}